

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void * NULLC::AllocObject(int size,uint type)

{
  ulong *__s;
  ExternTypeInfo *pEVar1;
  uint *puVar2;
  uint uVar3;
  char *error;
  uint uVar4;
  Range range;
  
  if (size < 0) {
    error = "ERROR: requested memory size is less than zero";
  }
  else {
    uVar3 = size + 8;
    if (globalMemoryLimit < usedMemory + uVar3) {
      CollectMemory();
      if (globalMemoryLimit < usedMemory + uVar3) {
        error = "ERROR: reached global memory maximum";
        goto LAB_0011ada8;
      }
    }
    else if (collectableMinimum < usedMemory + uVar3) {
      CollectMemory();
    }
    if ((int)uVar3 < 0x41) {
      if ((int)uVar3 < 0x11) {
        if ((int)uVar3 < 9) {
          __s = (ulong *)ObjectBlockPool<8,_8192>::Alloc((ObjectBlockPool<8,_8192> *)pool8);
          uVar4 = 8;
        }
        else {
          __s = (ulong *)ObjectBlockPool<16,_4096>::Alloc((ObjectBlockPool<16,_4096> *)pool16);
          uVar4 = 0x10;
        }
      }
      else if ((uint)size < 0x19) {
        __s = (ulong *)ObjectBlockPool<32,_2048>::Alloc((ObjectBlockPool<32,_2048> *)pool32);
        uVar4 = 0x20;
      }
      else {
        __s = (ulong *)ObjectBlockPool<64,_1024>::Alloc((ObjectBlockPool<64,_1024> *)pool64);
        uVar4 = 0x40;
      }
    }
    else if ((uint)size < 0xf9) {
      if ((uint)size < 0x79) {
        __s = (ulong *)ObjectBlockPool<128,_512>::Alloc((ObjectBlockPool<128,_512> *)pool128);
        uVar4 = 0x80;
      }
      else {
        __s = (ulong *)ObjectBlockPool<256,_256>::Alloc((ObjectBlockPool<256,_256> *)pool256);
        uVar4 = 0x100;
      }
    }
    else if ((uint)size < 0x1f9) {
      __s = (ulong *)ObjectBlockPool<512,_128>::Alloc((ObjectBlockPool<512,_128> *)pool512);
      uVar4 = 0x200;
    }
    else {
      puVar2 = (uint *)alignedAlloc(size,0xc);
      if (puVar2 == (uint *)0x0) {
        error = "Allocation failed.";
        goto LAB_0011ada8;
      }
      range.end = (void *)((long)puVar2 + (ulong)uVar3 + 4);
      range.start = puVar2;
      Tree<NULLC::Range>::insert((Tree<NULLC::Range> *)bigBlocks,&range);
      *puVar2 = uVar3;
      __s = (ulong *)(puVar2 + 1);
      uVar4 = uVar3;
    }
    usedMemory = usedMemory + uVar4;
    if (__s != (ulong *)0x0) {
      if (type == 0) {
        uVar4 = 0;
      }
      else {
        pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                           ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
        uVar4 = (pEVar1->typeFlags & 1) << 2;
      }
      memset(__s,0,(long)(int)uVar3);
      *__s = (ulong)(type << 8 | uVar4);
      return __s + 1;
    }
    error = "ERROR: allocation failed";
  }
LAB_0011ada8:
  nullcThrowError(error);
  return (void *)0x0;
}

Assistant:

void* NULLC::AllocObject(int size, unsigned type)
{
	if(size < 0)
	{
		nullcThrowError("ERROR: requested memory size is less than zero");
		return NULL;
	}

	void *data = NULL;
	size += sizeof(markerType);

	if((unsigned int)(usedMemory + size) > globalMemoryLimit)
	{
		CollectMemory();

		if((unsigned int)(usedMemory + size) > globalMemoryLimit)
		{
			nullcThrowError("ERROR: reached global memory maximum");
			return NULL;
		}
	}
	else if((unsigned int)(usedMemory + size) > collectableMinimum)
	{
		CollectMemory();
	}

	unsigned int realSize = size;
	if(size <= 64)
	{
		if(size <= 16)
		{
			if(size <= 8)
			{
				data = pool8.Alloc();
				realSize = 8;
			}else{
				data = pool16.Alloc();
				realSize = 16;
			}
		}else{
			if(size <= 32)
			{
				data = pool32.Alloc();
				realSize = 32;
			}else{
				data = pool64.Alloc();
				realSize = 64;
			}
		}
	}else{
		if(size <= 256)
		{
			if(size <= 128)
			{
				data = pool128.Alloc();
				realSize = 128;
			}else{
				data = pool256.Alloc();
				realSize = 256;
			}
		}else{
			if(size <= 512)
			{
				data = pool512.Alloc();
				realSize = 512;
			}else{
				void *ptr = NULLC::alignedAlloc(size - sizeof(markerType), 4 + sizeof(markerType));
				if(ptr == NULL)
				{
					nullcThrowError("Allocation failed.");
					return NULL;
				}

				Range range(ptr, (char*)ptr + size + 4);
				bigBlocks.insert(range);

				realSize = *(int*)ptr = size;
				data = (char*)ptr + 4;
			}
		}
	}
	usedMemory += realSize;

	if(data == NULL)
	{
		nullcThrowError("ERROR: allocation failed");
		return NULL;
	}
	int finalize = 0;
	if(type && (linker->exTypes[type].typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER))
		finalize = (int)OBJECT_FINALIZABLE;

	memset(data, 0, size);
	*(markerType*)data = finalize | (type << 8);
	return (char*)data + sizeof(markerType);
}